

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManComputeTruth_rec(If_DsdMan_t *p,int iDsd,word *pRes,uchar *pPermLits,int *pnSupp)

{
  word **ppwVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  If_DsdObj_t *pObj_00;
  word *pwVar5;
  bool bVar6;
  uint local_2064;
  word local_2058;
  word pFanins [12] [64];
  word pTtTemp_1 [3] [64];
  word pTtTemp [64];
  int iPermLit;
  If_DsdObj_t *pObj;
  int local_38;
  int fCompl;
  int iFanin;
  int i;
  int *pnSupp_local;
  uchar *pPermLits_local;
  word *pRes_local;
  int iDsd_local;
  If_DsdMan_t *p_local;
  
  uVar2 = Abc_LitIsCompl(iDsd);
  iVar3 = Abc_Lit2Var(iDsd);
  pObj_00 = If_DsdVecObj(&p->vObjs,iVar3);
  iVar3 = If_DsdObjType(pObj_00);
  if (iVar3 == 2) {
    if (pPermLits == (uchar *)0x0) {
      local_2064 = Abc_Var2Lit(*pnSupp,0);
    }
    else {
      local_2064 = (uint)pPermLits[*pnSupp];
    }
    *pnSupp = *pnSupp + 1;
    if (p->nVars < *pnSupp) {
      __assert_fail("(*pnSupp) <= p->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x555,
                    "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                   );
    }
    ppwVar1 = p->pTtElems;
    iVar3 = Abc_Lit2Var(local_2064);
    pwVar5 = ppwVar1[iVar3];
    iVar3 = p->nWords;
    uVar4 = Abc_LitIsCompl(local_2064);
    Abc_TtCopy(pRes,pwVar5,iVar3,uVar2 ^ uVar4);
  }
  else {
    iVar3 = If_DsdObjType(pObj_00);
    if ((iVar3 == 3) || (iVar3 = If_DsdObjType(pObj_00), iVar3 == 4)) {
      iVar3 = If_DsdObjType(pObj_00);
      if (iVar3 == 3) {
        Abc_TtConst1(pRes,p->nWords);
      }
      else {
        Abc_TtConst0(pRes,p->nWords);
      }
      fCompl = 0;
      while( true ) {
        iVar3 = If_DsdObjFaninNum(pObj_00);
        bVar6 = false;
        if (fCompl < iVar3) {
          local_38 = If_DsdObjFaninLit(pObj_00,fCompl);
          bVar6 = local_38 != 0;
        }
        if (!bVar6) break;
        If_DsdManComputeTruth_rec(p,local_38,pTtTemp_1[2] + 0x3f,pPermLits,pnSupp);
        iVar3 = If_DsdObjType(pObj_00);
        if (iVar3 == 3) {
          Abc_TtAnd(pRes,pRes,pTtTemp_1[2] + 0x3f,p->nWords,0);
        }
        else {
          Abc_TtXor(pRes,pRes,pTtTemp_1[2] + 0x3f,p->nWords,0);
        }
        fCompl = fCompl + 1;
      }
      if (uVar2 != 0) {
        Abc_TtNot(pRes,p->nWords);
      }
    }
    else {
      iVar3 = If_DsdObjType(pObj_00);
      if (iVar3 == 5) {
        fCompl = 0;
        while( true ) {
          iVar3 = If_DsdObjFaninNum(pObj_00);
          bVar6 = false;
          if (fCompl < iVar3) {
            local_38 = If_DsdObjFaninLit(pObj_00,fCompl);
            bVar6 = local_38 != 0;
          }
          if (!bVar6) break;
          If_DsdManComputeTruth_rec(p,local_38,pFanins[(long)fCompl + 0xb] + 0x3f,pPermLits,pnSupp);
          fCompl = fCompl + 1;
        }
        if (fCompl != 3) {
          __assert_fail("i == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                        ,0x570,
                        "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                       );
        }
        Abc_TtMux(pRes,pFanins[0xb] + 0x3f,pTtTemp_1[0] + 0x3f,pTtTemp_1[1] + 0x3f,p->nWords);
        if (uVar2 != 0) {
          Abc_TtNot(pRes,p->nWords);
        }
      }
      else {
        iVar3 = If_DsdObjType(pObj_00);
        if (iVar3 != 6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                        ,0x57e,
                        "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                       );
        }
        fCompl = 0;
        while( true ) {
          iVar3 = If_DsdObjFaninNum(pObj_00);
          bVar6 = false;
          if (fCompl < iVar3) {
            local_38 = If_DsdObjFaninLit(pObj_00,fCompl);
            bVar6 = local_38 != 0;
          }
          if (!bVar6) break;
          If_DsdManComputeTruth_rec(p,local_38,pFanins[(long)fCompl + -1] + 0x3f,pPermLits,pnSupp);
          fCompl = fCompl + 1;
        }
        pwVar5 = If_DsdObjTruth(p,pObj_00);
        Dau_DsdTruthCompose_rec
                  (pwVar5,(word (*) [64])&local_2058,pRes,*(uint *)&pObj_00->field_0x4 >> 0x1b,
                   p->nWords);
        if (uVar2 != 0) {
          Abc_TtNot(pRes,p->nWords);
        }
      }
    }
  }
  return;
}

Assistant:

void If_DsdManComputeTruth_rec( If_DsdMan_t * p, int iDsd, word * pRes, unsigned char * pPermLits, int * pnSupp )
{
    int i, iFanin, fCompl = Abc_LitIsCompl(iDsd);
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsd) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[*pnSupp] : Abc_Var2Lit(*pnSupp, 0);
        (*pnSupp)++;
        assert( (*pnSupp) <= p->nVars );
        Abc_TtCopy( pRes, p->pTtElems[Abc_Lit2Var(iPermLit)], p->nWords, fCompl ^ Abc_LitIsCompl(iPermLit) );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        word pTtTemp[DAU_MAX_WORD];
        if ( If_DsdObjType(pObj) == IF_DSD_AND )
            Abc_TtConst1( pRes, p->nWords );
        else
            Abc_TtConst0( pRes, p->nWords );
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            If_DsdManComputeTruth_rec( p, iFanin, pTtTemp, pPermLits, pnSupp );
            if ( If_DsdObjType(pObj) == IF_DSD_AND )
                Abc_TtAnd( pRes, pRes, pTtTemp, p->nWords, 0 );
            else
                Abc_TtXor( pRes, pRes, pTtTemp, p->nWords, 0 );
        }
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX ) // mux
    {
        word pTtTemp[3][DAU_MAX_WORD];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            If_DsdManComputeTruth_rec( p, iFanin, pTtTemp[i], pPermLits, pnSupp );
        assert( i == 3 );
        Abc_TtMux( pRes, pTtTemp[0], pTtTemp[1], pTtTemp[2], p->nWords );
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME ) // function
    {
        word pFanins[DAU_MAX_VAR][DAU_MAX_WORD];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            If_DsdManComputeTruth_rec( p, iFanin, pFanins[i], pPermLits, pnSupp );
        Dau_DsdTruthCompose_rec( If_DsdObjTruth(p, pObj), pFanins, pRes, pObj->nFans, p->nWords );
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    assert( 0 );

}